

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_convert_frames_ex
                    (void *pOut,ma_uint64 frameCountOut,void *pIn,ma_uint64 frameCountIn,
                    ma_data_converter_config *pConfig)

{
  undefined1 local_27b0 [8];
  ma_data_converter converter;
  ma_result result;
  ma_data_converter_config *pConfig_local;
  ma_uint64 frameCountIn_local;
  void *pIn_local;
  ma_uint64 frameCountOut_local;
  void *pOut_local;
  
  if ((frameCountIn == 0) || (pConfig == (ma_data_converter_config *)0x0)) {
    pOut_local = (void *)0x0;
  }
  else {
    pConfig_local = (ma_data_converter_config *)frameCountIn;
    frameCountIn_local = (ma_uint64)pIn;
    pIn_local = (void *)frameCountOut;
    frameCountOut_local = (ma_uint64)pOut;
    converter._10092_4_ = ma_data_converter_init(pConfig,(ma_data_converter *)local_27b0);
    if (converter._10092_4_ == 0) {
      if (frameCountOut_local == 0) {
        pIn_local = (void *)ma_data_converter_get_expected_output_frame_count
                                      ((ma_data_converter *)local_27b0,(ma_uint64)pConfig_local);
      }
      else {
        converter._10092_4_ =
             ma_data_converter_process_pcm_frames
                       ((ma_data_converter *)local_27b0,(void *)frameCountIn_local,
                        (ma_uint64 *)&pConfig_local,(void *)frameCountOut_local,
                        (ma_uint64 *)&pIn_local);
        if (converter._10092_4_ != 0) {
          pIn_local = (void *)0x0;
        }
      }
      ma_data_converter_uninit((ma_data_converter *)local_27b0);
      pOut_local = pIn_local;
    }
    else {
      pOut_local = (void *)0x0;
    }
  }
  return (ma_uint64)pOut_local;
}

Assistant:

MA_API ma_uint64 ma_convert_frames_ex(void* pOut, ma_uint64 frameCountOut, const void* pIn, ma_uint64 frameCountIn, const ma_data_converter_config* pConfig)
{
    ma_result result;
    ma_data_converter converter;

    if (frameCountIn == 0 || pConfig == NULL) {
        return 0;
    }

    result = ma_data_converter_init(pConfig, &converter);
    if (result != MA_SUCCESS) {
        return 0;   /* Failed to initialize the data converter. */
    }

    if (pOut == NULL) {
        frameCountOut = ma_data_converter_get_expected_output_frame_count(&converter, frameCountIn);
    } else {
        result = ma_data_converter_process_pcm_frames(&converter, pIn, &frameCountIn, pOut, &frameCountOut);
        if (result != MA_SUCCESS) {
            frameCountOut = 0;
        }
    }

    ma_data_converter_uninit(&converter);
    return frameCountOut;
}